

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpack.cpp
# Opt level: O2

void CVmPack::unpack_item(vm_val_t *val,CVmDataSource *src,CVmPackType *t,CVmPackGroup *group)

{
  wchar_t wVar1;
  CVmObjPageEntry *pCVar2;
  ushort *puVar3;
  uint uVar4;
  char cVar5;
  int32_t val_1;
  int iVar6;
  int iVar7;
  uint uVar8;
  CharConv *this;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar9;
  char *ptr;
  long lVar10;
  byte bVar11;
  size_t len;
  ulong uVar12;
  undefined8 uStack_140;
  char buf [256];
  
  uStack_140 = (code *)0x26a157;
  this = CharConv::conv_for_type(t);
  if (this != (CharConv *)0x0) {
    uVar8 = t->count;
    if ((int)uVar8 < 1 && t->null_term != 0) {
      CharConv::unpackz(this,val,src);
      return;
    }
    uVar12 = 1;
    if (-1 < (int)uVar8) {
      uVar12 = (ulong)uVar8;
    }
    if (t->count_in_bytes != 0) {
      uStack_140 = (code *)0x26a1f1;
      uVar12 = (**(code **)(*(long *)this + 0x20))();
    }
    uVar8 = (uint)uVar12;
    if (uVar8 != 0) {
      if ((t->count == -2) || (t->up_to_count != 0)) {
        uStack_140 = (code *)0x26a218;
        iVar6 = (*src->_vptr_CVmDataSource[6])(src);
        uStack_140 = (code *)0x26a224;
        iVar7 = (*src->_vptr_CVmDataSource[7])(src);
        uStack_140 = (code *)0x26a234;
        uVar9 = (**(code **)(*(long *)this + 0x20))
                          (this,CONCAT44(extraout_var,iVar6) - CONCAT44(extraout_var_00,iVar7));
        if (t->count == -2) {
          uVar12 = uVar9 & 0xffffffff;
          if (0x7fffffff < (long)uVar9) {
LAB_0026a248:
            uStack_140 = (code *)0x26a252;
            err_throw(0x7e7);
          }
        }
        else {
          uVar4 = (uint)uVar9;
          if ((long)(int)uVar8 <= (long)uVar9) {
            uVar4 = uVar8;
          }
          uVar12 = (ulong)uVar4;
        }
      }
      uStack_140 = (code *)0x26a2c0;
      cVar5 = get_padding_char(t->type_code);
      uStack_140 = (code *)0x26a2d8;
      (**(code **)(*(long *)this + 0x30))(this,val,src,uVar12 & 0xffffffff,cVar5);
      if (t->null_term == 0) {
        return;
      }
      uStack_140 = (code *)0x26a2f0;
      (**(code **)(*(long *)this + 0x38))(this);
      if (val->typ != VM_OBJ) {
        return;
      }
      uStack_140 = (code *)0x26a301;
      iVar6 = CVmObjString::is_string_obj((val->val).obj);
      if (iVar6 == 0) {
        return;
      }
      pCVar2 = G_obj_table_X.pages_[(val->val).obj >> 0xc];
      uVar8 = (val->val).obj & 0xfff;
      puVar3 = *(ushort **)((long)&pCVar2[uVar8].ptr_ + 8);
      uStack_140 = (code *)0x26a33c;
      ptr = (char *)memchr(puVar3 + 1,0,(ulong)*puVar3);
      if (ptr == (char *)0x0) {
        return;
      }
      CVmObjString::cons_shrink_buffer((CVmObjString *)(pCVar2 + uVar8),ptr);
      return;
    }
    uStack_140 = (code *)0x26a2a6;
    buf._0_4_ = CVmObjString::create(0,0);
    goto LAB_0026a430;
  }
  wVar1 = t->type_code;
  switch(wVar1) {
  case L'c':
    uStack_140 = (code *)0x26a1c9;
    read_num_bytes(buf,src,1,t);
    buf._0_4_ = SEXT14(buf[0]);
    break;
  case L'd':
    uStack_140 = (code *)0x26a40b;
    read_num_bytes(buf,src,8,t);
    iVar6 = 0x40;
    goto LAB_0026a425;
  case L'e':
  case L'g':
  case L'h':
  case L'i':
  case L'j':
  case L'm':
  case L'n':
  case L'o':
  case L'p':
  case L'r':
    goto switchD_0026a1b3_caseD_65;
  case L'f':
    uStack_140 = (code *)0x26a423;
    read_num_bytes(buf,src,4,t);
    iVar6 = 0x20;
LAB_0026a425:
    uStack_140 = (code *)0x26a430;
    buf._0_4_ = CVmObjBigNum::create_from_ieee754(0,buf,iVar6);
LAB_0026a430:
    val->typ = VM_OBJ;
    goto LAB_0026a51f;
  case L'k':
    uVar12 = 0;
LAB_0026a3b8:
    if (uVar12 != 0x100) {
      uStack_140 = (code *)0x26a3d8;
      iVar6 = (*src->_vptr_CVmDataSource[2])(src,buf + uVar12,1);
      if (iVar6 != 0) {
        uStack_140 = read_num_bytes;
        err_throw(0x65);
      }
      bVar11 = buf[uVar12];
      if ((char)bVar11 < '\0') goto code_r0x0026a3ec;
      len = uVar12 + 1;
      if ((uVar12 < 4) || ((uVar12 == 4 && ((byte)buf[0] < 8)))) {
        bVar11 = 0;
        buf._0_4_ = 0;
        do {
          buf._0_4_ = buf._0_4_ + ((int)buf[len - 1] << (bVar11 & 0x1f));
          bVar11 = bVar11 + 7;
          len = len - 1;
        } while (len != 0);
        break;
      }
      uStack_140 = (code *)0x26a58c;
      buf._0_4_ = CVmObjBigNum::create_from_ber(0,buf,len);
      goto LAB_0026a430;
    }
    goto LAB_0026a248;
  case L'l':
    uStack_140 = (code *)0x26a44f;
    read_num_bytes(buf,src,4,t);
    break;
  case L'q':
    uStack_140 = (code *)0x26a375;
    read_num_bytes(buf,src,8,t);
    if ((t->tilde == 0) ||
       (((int)buf._0_4_ < 0 || buf._4_4_ != 0) && (buf._4_4_ != -1 || (int)buf._0_4_ >= 0))) {
      uStack_140 = (code *)0x26a3af;
      buf._0_4_ = CVmObjBigNum::create_rp8s(0,buf);
      goto LAB_0026a430;
    }
    break;
  case L's':
    uStack_140 = (code *)0x26a46c;
    read_num_bytes(buf,src,2,t);
    buf._0_4_ = SEXT24((short)buf._0_2_);
    break;
  default:
    if (wVar1 == L'@') {
      uStack_140 = (code *)0x26a53d;
      iVar6 = (*src->_vptr_CVmDataSource[7])(src);
      if (t->bang == 0) {
        iVar7 = (int)group->stream_ofs;
      }
      else {
        uStack_140 = (code *)0x26a54f;
        lVar10 = CVmPackGroup::root_stream_ofs(group);
        iVar7 = (int)lVar10;
      }
      val->typ = VM_INT;
      (val->val).obj = iVar6 - iVar7;
      return;
    }
    if (wVar1 == L'C') {
      uStack_140 = (code *)0x26a4bb;
      read_num_bytes(buf,src,1,t);
      buf._0_4_ = buf._0_4_ & 0xff;
    }
    else {
      if (wVar1 == L'L') {
        uStack_140 = (code *)0x26a4d6;
        read_num_bytes(buf,src,4,t);
        if ((-1 < (int)buf._0_4_) && (t->tilde != 0)) {
          val->typ = VM_INT;
          (val->val).obj = buf._0_4_;
          return;
        }
        uStack_140 = (code *)0x26a55b;
        buf._0_4_ = CVmObjBigNum::createu(0,(ulong)(uint)buf._0_4_,10);
        goto LAB_0026a430;
      }
      if (wVar1 == L'Q') {
        uStack_140 = (code *)0x26a501;
        read_num_bytes(buf,src,8,t);
        if (((t->tilde == 0) || (buf._4_4_ != 0)) || ((int)buf._0_4_ < 0)) {
          uStack_140 = (code *)0x26a56a;
          buf._0_4_ = CVmObjBigNum::create_rp8(0,buf);
          goto LAB_0026a430;
        }
      }
      else {
        if (wVar1 != L'S') {
          return;
        }
        uStack_140 = (code *)0x26a293;
        read_num_bytes(buf,src,2,t);
        buf._0_4_ = buf._0_4_ & 0xffff;
      }
    }
  }
  val->typ = VM_INT;
LAB_0026a51f:
  (val->val).obj = buf._0_4_;
switchD_0026a1b3_caseD_65:
  return;
code_r0x0026a3ec:
  buf[uVar12] = bVar11 & 0x7f;
  uVar12 = uVar12 + 1;
  goto LAB_0026a3b8;
}

Assistant:

void CVmPack::unpack_item(VMG_ vm_val_t *val,
                          CVmDataSource *src, const CVmPackType *t,
                          const CVmPackGroup *group)
{
    /* check for a character conversion */
    CharConv *cvtchar = CharConv::conv_for_type(t);
    if (cvtchar != 0 && t->null_term && t->count <= 0)
    {
        /* 
         *   It's a null-terminated string type without a fixed field width.
         *   Use the special unpacking method for this type.  
         */
        cvtchar->unpackz(vmg_ val, src);

        /* done */
        return;
    }
    if (cvtchar != 0)
    {
        /* character string - the repeat count is the length */
        int count = t->get_count();

        /* if the count is in bytes, convert it */
        if (t->count_in_bytes)
            count = cvtchar->bytes_to_count(count);

        /* if the character count is zero, return an empty string */
        if (count == 0)
        {
            val->set_obj(CVmObjString::create(vmg_ FALSE, 0));
            return;
        }

        /* if it's '*', we read the rest of the data source */
        if (t->count == ITER_STAR || t->up_to_count)
        {
            /* 
             *   get the remaining length, and convert it to a repeat count
             *   appropriate to the string conversion type 
             */
            long l = cvtchar->bytes_to_count(src->get_size() - src->get_pos());

            /* use 'l' as a maximum for 'n*', or the actual count for '*' */
            if (t->count == ITER_STAR)
            {
                /* 
                 *   '*' means read the whole rest of the file - that's a
                 *   long value, so cast it to int, making sure we don't
                 *   overflow 
                 */
                count = (int)l;
                if (l > INT_MAX)
                    err_throw(VMERR_NUM_OVERFLOW);
            }
            else
            {
                /* 
                 *   'n*' means read up to n, stopping at EOF, so stop at 'l'
                 *   if it's less than the specified count 
                 */
                if (l < count)
                    count = (int)l;
            }
        }

        /* figure the padding type */
        char pad = get_padding_char(t->type_code);

        /* unpack the string */
        cvtchar->unpack(vmg_ val, src, count, pad);

        /* check for null termination */
        if (t->null_term)
        {
            /* skip the null, which is tacked on after the fixed length */
            cvtchar->readch(src);

            /* terminate the string at the first null, if present */
            if (val->typ == VM_OBJ
                && CVmObjString::is_string_obj(vmg_ val->val.obj))
            {
                /* get the string */
                CVmObjString *str = (CVmObjString *)vm_objp(vmg_ val->val.obj);

                /* scan for a null byte */
                char *nul = (char *)memchr(
                    str->cons_get_buf(), 0, str->cons_get_len());

                /* if we found a null byte, terminate the string there */
                if (nul != 0)
                    str->cons_shrink_buffer(vmg_ nul);
            }
        }

        /* done */
        return;
    }

    /* it's not a string; check the numeric types */
    char buf[256];
    switch (t->type_code)
    {
    case '@':
        /* 
         *   @? retrieves the current position, relative to the current group
         *   or, if ! is specified, relative to the start of the string
         */
        val->set_int(src->get_pos() -
                     (t->bang ? group->root_stream_ofs() : group->stream_ofs));
        break;
        
    case 'c':
        /* signed byte */
        read_num_bytes(buf, src, 1, t);
        val->set_int((char)buf[0]);
        break;

    case 'C':
        /* unsigned byte */
        read_num_bytes(buf, src, 1, t);
        val->set_int((unsigned char)buf[0]);
        break;

    case 's':
        /* signed 16-bit short */
        read_num_bytes(buf, src, 2, t);
        val->set_int(osrp2s(buf));
        break;
        
    case 'S':
        /* unsigned 16-bit short */
        read_num_bytes(buf, src, 2, t);
        val->set_int((unsigned short)osrp2(buf));
        break;
        
    case 'l':
        /* signed 32-bit long */
        read_num_bytes(buf, src, 4, t);
        val->set_int(osrp4s(buf));
        break;
        
    case 'L':
        /*
         *   Unsigned 32-bit long.  The VM_INT type is a signed long, so we
         *   can't use this to represent the full range of unsigned longs.
         *   Instead, use BigNumber.  Note that we could check the file value
         *   and use VM_INT if the value actually fits (i.e., it's less than
         *   0x7fffffff); this might be desirable in some cases because
         *   VM_INT is much more efficient than BigNumber.  However, since
         *   the caller is asking for type 'L', they're clearly expecting the
         *   full unsigned 32-bit range, which might mean they plan to do
         *   further arithmetic on the value we read, in which case they'd
         *   expect this arithmetic to be safe on unsigned 32-bit values.
         *   The only way we can guarantee this is to use a BigNumber for the
         *   value regardless of whether or not it fits in a VM_INT.
         *   
         *   If the ~ qualifier is set, unpack into an int if the value fits
         *   in a signed 32-bit int.  
         */
        {
            read_num_bytes(buf, src, 4, t);
            unsigned long lu = osrp4(buf);
            if (t->tilde && lu <= 0x7fffffff)
                val->set_int((long)lu);
            else
                val->set_obj(CVmObjBigNum::createu(vmg_ FALSE, lu, 10));
        }
        break;

    case 'q':
        /* 
         *   "Long long" 64-bit integer, signed.  There's no VM_xxx primitive
         *   type that can handle a value this large, so use BigNumber.  Read
         *   the 8-byte file value.
         *   
         *   If the ~ qualifier is set, and the high part of the value is all
         *   zeros or all '1' bits, return it as an integer.  Note that the
         *   buffer is in our standard osrp8 format, which is little-endian
         *   2's complement, so we can inspect the byte values portably.  
         */
        read_num_bytes(buf, src, 8, t);
        if (t->tilde
            && ((memcmp(buf+4, "\0\0\0\0", 4) == 0
                 && (buf[3] & 0x80) == 0)
                || (memcmp(buf+4, "\377\377\377\377", 4) == 0
                    && (buf[3] & 0x80) != 0)))
            val->set_int(osrp4s(buf));
        else
            val->set_obj(CVmObjBigNum::create_rp8s(vmg_ FALSE, buf));
        break;

    case 'Q':
        /* 
         *   "Long long" 64-bit integer, unsigned.  Unpack as a BigNumber,
         *   unless the ~ qualifier is set and the value will fit in an int.
         */
        read_num_bytes(buf, src, 8, t);
        if (t->tilde
            && memcmp(buf+4, "\0\0\0\0", 4) == 0
            && (buf[3] & 0x80) == 0)
            val->set_int(osrp4s(buf));
        else
            val->set_obj(CVmObjBigNum::create_rp8(vmg_ FALSE, buf));
        break;

    case 'k':
        /* 
         *   BER compressed unsigned integer.  This is a sequence of 7-bit,
         *   base-128 "digits", most significant digit first.  The high bit
         *   (0x80) is set on each digit except the last, which tells us
         *   where the value ends.  Read bytes one at a time until we reach
         *   the last byte or run out of buffer space.  
         */
        {
            size_t i;
            for (i = 0 ; ; )
            {
                /* if we're out of buffer space, throw an error */
                if (i >= sizeof(buf))
                    err_throw(VMERR_NUM_OVERFLOW);

                /* read the next byte */
                if (src->read(buf + i, 1))
                    err_throw(VMERR_READ_FILE);

                /* if the high bit isn't set, this is the last byte */
                if ((buf[i++] & 0x80) == 0)
                    break;

                /* keep just the low-order 7 bits of the value */
                buf[i-1] &= 0x7F;
            }

            /* 
             *   If the value is 31 bits or fewer, return it as an integer.
             *   Otherwise, return it as a BigNumber.  31 bits fits in 4
             *   bytes (7*4=28) plus 3 bits of the MSB, so if we have more
             *   than 5 bytes, or any of bits 4-8 of the MSB are set, we need
             *   a BigNumber.  (Why 31 bits and not 32?  Because BER values
             *   are unsigned, and our int32 type is signed, meaning it only
             *   holds 31 bits for a positive value.)  
             */
            if (i < 5 || (i == 5 && (buf[0] & 0xF8) == 0))
            {
                /* it fits in a 32-bit integer - decode it */
                val->set_int(decode_ber(buf, i));
            }
            else
            {
                /* more than 31 bits - decode into a BigNumber */
                val->set_obj(CVmObjBigNum::create_from_ber(vmg_ FALSE, buf, i));
            }
        }
        break;
        
    case 'f':
        /* 
         *   Float - read the 32-bit float value, and return it as a
         *   BigNumber value.  Our standard IEEE 754-2008 32-bit format
         *   represents 7.22 decimal digits of precision, so keep 8 digits.  
         */
        read_num_bytes(buf, src, 4, t);
        val->set_obj(CVmObjBigNum::create_from_ieee754(vmg_ FALSE, buf, 32));
        break;
        
    case 'd':
        /* 
         *   Double - read the 64-bit double value, and return it as a
         *   BigNumber value.  Our standard IEEE 754-2008 64-bit format
         *   represents 15.95 decimal digits of precision.  
         */
        read_num_bytes(buf, src, 8, t);
        val->set_obj(CVmObjBigNum::create_from_ieee754(vmg_ FALSE, buf, 64));
        break;
    }
}